

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FunctionBody * __thiscall
ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ByteCodeGenerator *this,ParseNode *pnode)

{
  bool bVar1;
  JavascriptLibrary *pJVar2;
  ParseNodeFnc *this_00;
  FunctionBody *local_20;
  FunctionBody *func;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  pJVar2 = Js::ScriptContext::GetLibrary(this->scriptContext);
  local_20 = Js::JavascriptLibrary::GetFakeGlobalFuncForUndefer(pJVar2);
  if (local_20 == (FunctionBody *)0x0) {
    local_20 = MakeGlobalFunctionBody(this,pnode);
    pJVar2 = Js::ScriptContext::GetLibrary(this->scriptContext);
    Js::JavascriptLibrary::SetFakeGlobalFuncForUndefer(pJVar2,local_20);
  }
  this_00 = ParseNode::AsParseNodeFnc(pnode);
  bVar1 = ParseNodeFnc::GetStrictMode(this_00);
  if (bVar1) {
    Js::ParseableFunctionInfo::SetIsStrictMode(&local_20->super_ParseableFunctionInfo);
  }
  return local_20;
}

Assistant:

Js::FunctionBody *ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ParseNode *pnode)
{
    Js::FunctionBody *func = scriptContext->GetLibrary()->GetFakeGlobalFuncForUndefer();
    if (!func)
    {
        func = this->MakeGlobalFunctionBody(pnode);
        scriptContext->GetLibrary()->SetFakeGlobalFuncForUndefer(func);
    }
    if (pnode->AsParseNodeFnc()->GetStrictMode() != 0)
    {
        func->SetIsStrictMode();
    }

    return func;
}